

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O0

void __thiscall webpp::Server::Server(Server *this,unsigned_short port,size_t num_threads)

{
  Logger *__p;
  tcp local_30 [4];
  size_t local_20;
  size_t num_threads_local;
  Server *pSStack_10;
  unsigned_short port_local;
  Server *this_local;
  
  local_20 = num_threads;
  num_threads_local._6_2_ = port;
  pSStack_10 = this;
  std::
  vector<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<webpp::Response>_(webpp::Request_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<webpp::Response>_(webpp::Request_&)>_>_>_>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<webpp::Response>_(webpp::Request_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<webpp::Response>_(webpp::Request_&)>_>_>_>_>_>_>_>
  ::vector(&this->all_routes);
  boost::asio::io_context::io_context(&this->io_service);
  local_30[0] = boost::asio::ip::tcp::v4();
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            (&this->endpoint,local_30,num_threads_local._6_2_);
  boost::asio::
  basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket_acceptor<boost::asio::io_context>
            (&this->acceptor,&this->io_service,&this->endpoint,true,(type *)0x0);
  __p = (Logger *)operator_new(1);
  std::shared_ptr<webpp::Logger>::shared_ptr<webpp::Logger,void>(&this->logger,__p);
  this->num_threads = local_20;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->threads);
  return;
}

Assistant:

Server(unsigned short port, size_t num_threads = 1)
      : endpoint(boost::asio::ip::tcp::v4(), port),
        acceptor(io_service, endpoint),
        num_threads(num_threads),
        logger(new Logger()) {}